

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool wabt::anon_unknown_1::IsModuleField(TokenTypePair pair)

{
  value_type vVar1;
  reference pvVar2;
  array<wabt::TokenType,_2UL> local_14;
  TokenTypePair pair_local;
  
  local_14._M_elems = pair._M_elems;
  pvVar2 = std::array<wabt::TokenType,_2UL>::operator[](&local_14,0);
  if (*pvVar2 == Lpar) {
    pvVar2 = std::array<wabt::TokenType,_2UL>::operator[](&local_14,1);
    vVar1 = *pvVar2;
    if ((((((vVar1 == Data) || (vVar1 == Elem)) || (vVar1 - Event < 2)) ||
         ((vVar1 - Global < 2 || (vVar1 == Memory)))) ||
        ((vVar1 == Start || ((vVar1 == Table || (vVar1 == Type)))))) || (vVar1 == First_RefKind)) {
      pair_local._M_elems[0]._3_1_ = 1;
    }
    else {
      pair_local._M_elems[0]._3_1_ = First >> 0x18;
    }
  }
  else {
    pair_local._M_elems[0]._3_1_ = First >> 0x18;
  }
  return (bool)pair_local._M_elems[0]._3_1_;
}

Assistant:

bool IsModuleField(TokenTypePair pair) {
  if (pair[0] != TokenType::Lpar) {
    return false;
  }

  switch (pair[1]) {
    case TokenType::Data:
    case TokenType::Elem:
    case TokenType::Event:
    case TokenType::Export:
    case TokenType::Func:
    case TokenType::Type:
    case TokenType::Global:
    case TokenType::Import:
    case TokenType::Memory:
    case TokenType::Start:
    case TokenType::Table:
      return true;
    default:
      return false;
  }
}